

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O1

error<idx2::mmap_err_code> idx2::UnmapFile(mmap_file *MMap)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long *in_FS_OFFSET;
  error<idx2::mmap_err_code> eVar4;
  
  iVar1 = munmap((MMap->Buf).Data,(MMap->Buf).Bytes);
  if (iVar1 == -1) {
    uVar3 = 0x1a;
    uVar2 = 0xb0;
  }
  else {
    (MMap->Buf).Data = (byte *)0x0;
    (MMap->Buf).Bytes = 0;
    uVar2 = 0xb4;
    uVar3 = 0;
  }
  *(char **)(*in_FS_OFFSET + -0x880) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x680) = uVar2;
  eVar4.Code = (int)uVar3;
  eVar4.StackIdx = (char)((ulong)uVar3 >> 0x20);
  eVar4.StrGened = (bool)(char)((ulong)uVar3 >> 0x28);
  eVar4._14_2_ = (short)((ulong)uVar3 >> 0x30);
  eVar4.Msg = "";
  return eVar4;
}

Assistant:

error<mmap_err_code>
UnmapFile(mmap_file* MMap)
{
#if defined(_WIN32)
  if (!UnmapViewOfFile(MMap->Buf.Data))
  {
    CloseHandle(MMap->FileMapping);
    return idx2_Error(mmap_err_code::UnmapFailed);
  }
  if (!CloseHandle(MMap->FileMapping))
    return idx2_Error(mmap_err_code::UnmapFailed);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  if (munmap(MMap->Buf.Data, MMap->Buf.Bytes) == -1)
    return idx2_Error(mmap_err_code::UnmapFailed);
#endif
  MMap->Buf.Data = nullptr;
  MMap->Buf.Bytes = 0;
  return idx2_Error(mmap_err_code::NoError);
}